

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void avg_cdf_symbol(aom_cdf_prob *cdf_ptr_left,aom_cdf_prob *cdf_ptr_tr,int num_cdfs,int cdf_stride,
                   int nsymbs,int wt_left,int wt_tr)

{
  ulong uVar1;
  int j;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)num_cdfs;
  if (num_cdfs < 1) {
    uVar1 = uVar3;
  }
  for (; uVar3 != uVar1; uVar3 = uVar3 + 1) {
    for (lVar2 = 0; lVar2 <= nsymbs; lVar2 = lVar2 + 1) {
      cdf_ptr_left[lVar2] =
           (aom_cdf_prob)
           ((int)((uint)cdf_ptr_left[lVar2] * wt_left + (wt_tr + wt_left) / 2 +
                 (uint)cdf_ptr_tr[lVar2] * wt_tr) / (wt_tr + wt_left));
    }
    cdf_ptr_left = cdf_ptr_left + cdf_stride;
    cdf_ptr_tr = cdf_ptr_tr + cdf_stride;
  }
  return;
}

Assistant:

static void avg_cdf_symbol(aom_cdf_prob *cdf_ptr_left, aom_cdf_prob *cdf_ptr_tr,
                           int num_cdfs, int cdf_stride, int nsymbs,
                           int wt_left, int wt_tr) {
  for (int i = 0; i < num_cdfs; i++) {
    for (int j = 0; j <= nsymbs; j++) {
      cdf_ptr_left[i * cdf_stride + j] =
          (aom_cdf_prob)(((int)cdf_ptr_left[i * cdf_stride + j] * wt_left +
                          (int)cdf_ptr_tr[i * cdf_stride + j] * wt_tr +
                          ((wt_left + wt_tr) / 2)) /
                         (wt_left + wt_tr));
      assert(cdf_ptr_left[i * cdf_stride + j] >= 0 &&
             cdf_ptr_left[i * cdf_stride + j] < CDF_PROB_TOP);
    }
  }
}